

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wedge_utils_avx2.c
# Opt level: O0

void av1_wedge_compute_delta_squares_avx2(int16_t *d,int16_t *a,int16_t *b,int N)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int in_ECX;
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined8 *in_RDI;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  __m256i v_r3_w;
  __m256i v_r2_w;
  __m256i v_r1_w;
  __m256i v_r0_w;
  __m256i v_r3h_w;
  __m256i v_r3l_w;
  __m256i v_r2h_w;
  __m256i v_r2l_w;
  __m256i v_r1h_w;
  __m256i v_r1l_w;
  __m256i v_r0h_w;
  __m256i v_r0l_w;
  __m256i v_abh3n_w;
  __m256i v_abl3n_w;
  __m256i v_abh2n_w;
  __m256i v_abl2n_w;
  __m256i v_abh1n_w;
  __m256i v_abl1n_w;
  __m256i v_abh0n_w;
  __m256i v_abl0n_w;
  __m256i v_ab3h_w;
  __m256i v_ab3l_w;
  __m256i v_ab2h_w;
  __m256i v_ab2l_w;
  __m256i v_ab1h_w;
  __m256i v_ab1l_w;
  __m256i v_ab0h_w;
  __m256i v_ab0l_w;
  __m256i v_b3_w;
  __m256i v_a3_w;
  __m256i v_b2_w;
  __m256i v_a2_w;
  __m256i v_b1_w;
  __m256i v_a1_w;
  __m256i v_b0_w;
  __m256i v_a0_w;
  __m256i v_neg_w;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  int local_8fc;
  undefined1 (*local_8f8) [32];
  undefined1 (*local_8f0) [32];
  undefined8 *local_8e8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar18 = vpinsrd_avx(ZEXT416(0xffff0001),0xffff0001,1);
  auVar18 = vpinsrd_avx(auVar18,0xffff0001,2);
  auVar18 = vpinsrd_avx(auVar18,0xffff0001,3);
  auVar17 = vpinsrd_avx(ZEXT416(0xffff0001),0xffff0001,1);
  auVar17 = vpinsrd_avx(auVar17,0xffff0001,2);
  auVar17 = vpinsrd_avx(auVar17,0xffff0001,3);
  auVar17 = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar17;
  auVar18 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar18;
  uStack_70 = auVar18._0_8_;
  uStack_68 = auVar18._8_8_;
  local_8fc = in_ECX;
  local_8f8 = in_RDX;
  local_8f0 = in_RSI;
  local_8e8 = in_RDI;
  do {
    auVar1 = vlddqu_avx(*local_8f0);
    auVar2 = vlddqu_avx(*local_8f8);
    auVar3 = vlddqu_avx(local_8f0[1]);
    auVar4 = vlddqu_avx(local_8f8[1]);
    auVar5 = vlddqu_avx(local_8f0[2]);
    auVar6 = vlddqu_avx(local_8f8[2]);
    auVar7 = vlddqu_avx(local_8f0[3]);
    auVar8 = vlddqu_avx(local_8f8[3]);
    auVar13 = vpunpcklwd_avx2(auVar1,auVar2);
    auVar9 = vpunpckhwd_avx2(auVar1,auVar2);
    auVar14 = vpunpcklwd_avx2(auVar3,auVar4);
    auVar10 = vpunpckhwd_avx2(auVar3,auVar4);
    auVar15 = vpunpcklwd_avx2(auVar5,auVar6);
    auVar11 = vpunpckhwd_avx2(auVar5,auVar6);
    auVar16 = vpunpcklwd_avx2(auVar7,auVar8);
    auVar12 = vpunpckhwd_avx2(auVar7,auVar8);
    auVar1._16_8_ = uStack_70;
    auVar1._0_16_ = auVar17;
    auVar1._24_8_ = uStack_68;
    auVar1 = vpsignw_avx2(auVar13,auVar1);
    auVar2._16_8_ = uStack_70;
    auVar2._0_16_ = auVar17;
    auVar2._24_8_ = uStack_68;
    auVar2 = vpsignw_avx2(auVar9,auVar2);
    auVar3._16_8_ = uStack_70;
    auVar3._0_16_ = auVar17;
    auVar3._24_8_ = uStack_68;
    auVar3 = vpsignw_avx2(auVar14,auVar3);
    auVar4._16_8_ = uStack_70;
    auVar4._0_16_ = auVar17;
    auVar4._24_8_ = uStack_68;
    auVar4 = vpsignw_avx2(auVar10,auVar4);
    auVar5._16_8_ = uStack_70;
    auVar5._0_16_ = auVar17;
    auVar5._24_8_ = uStack_68;
    auVar5 = vpsignw_avx2(auVar15,auVar5);
    auVar6._16_8_ = uStack_70;
    auVar6._0_16_ = auVar17;
    auVar6._24_8_ = uStack_68;
    auVar6 = vpsignw_avx2(auVar11,auVar6);
    auVar7._16_8_ = uStack_70;
    auVar7._0_16_ = auVar17;
    auVar7._24_8_ = uStack_68;
    auVar7 = vpsignw_avx2(auVar16,auVar7);
    auVar8._16_8_ = uStack_70;
    auVar8._0_16_ = auVar17;
    auVar8._24_8_ = uStack_68;
    auVar8 = vpsignw_avx2(auVar12,auVar8);
    auVar1 = vpmaddwd_avx2(auVar13,auVar1);
    auVar2 = vpmaddwd_avx2(auVar9,auVar2);
    auVar3 = vpmaddwd_avx2(auVar14,auVar3);
    auVar4 = vpmaddwd_avx2(auVar10,auVar4);
    auVar5 = vpmaddwd_avx2(auVar15,auVar5);
    auVar6 = vpmaddwd_avx2(auVar11,auVar6);
    auVar7 = vpmaddwd_avx2(auVar16,auVar7);
    auVar8 = vpmaddwd_avx2(auVar12,auVar8);
    auVar1 = vpackssdw_avx2(auVar1,auVar2);
    auVar2 = vpackssdw_avx2(auVar3,auVar4);
    auVar3 = vpackssdw_avx2(auVar5,auVar6);
    auVar4 = vpackssdw_avx2(auVar7,auVar8);
    local_d40 = auVar1._0_8_;
    uStack_d38 = auVar1._8_8_;
    uStack_d30 = auVar1._16_8_;
    uStack_d28 = auVar1._24_8_;
    *local_8e8 = local_d40;
    local_8e8[1] = uStack_d38;
    local_8e8[2] = uStack_d30;
    local_8e8[3] = uStack_d28;
    local_d60 = auVar2._0_8_;
    uStack_d58 = auVar2._8_8_;
    uStack_d50 = auVar2._16_8_;
    uStack_d48 = auVar2._24_8_;
    local_8e8[4] = local_d60;
    local_8e8[5] = uStack_d58;
    local_8e8[6] = uStack_d50;
    local_8e8[7] = uStack_d48;
    local_d80 = auVar3._0_8_;
    uStack_d78 = auVar3._8_8_;
    uStack_d70 = auVar3._16_8_;
    uStack_d68 = auVar3._24_8_;
    local_8e8[8] = local_d80;
    local_8e8[9] = uStack_d78;
    local_8e8[10] = uStack_d70;
    local_8e8[0xb] = uStack_d68;
    local_da0 = auVar4._0_8_;
    uStack_d98 = auVar4._8_8_;
    uStack_d90 = auVar4._16_8_;
    uStack_d88 = auVar4._24_8_;
    local_8e8[0xc] = local_da0;
    local_8e8[0xd] = uStack_d98;
    local_8e8[0xe] = uStack_d90;
    local_8e8[0xf] = uStack_d88;
    local_8f0 = local_8f0 + 4;
    local_8f8 = local_8f8 + 4;
    local_8e8 = local_8e8 + 0x10;
    local_8fc = local_8fc + -0x40;
  } while (local_8fc != 0);
  return;
}

Assistant:

void av1_wedge_compute_delta_squares_avx2(int16_t *d, const int16_t *a,
                                          const int16_t *b, int N) {
  const __m256i v_neg_w = _mm256_set1_epi32((int)0xffff0001);

  assert(N % 64 == 0);

  do {
    const __m256i v_a0_w = _mm256_lddqu_si256((__m256i *)(a));
    const __m256i v_b0_w = _mm256_lddqu_si256((__m256i *)(b));
    const __m256i v_a1_w = _mm256_lddqu_si256((__m256i *)(a + 16));
    const __m256i v_b1_w = _mm256_lddqu_si256((__m256i *)(b + 16));
    const __m256i v_a2_w = _mm256_lddqu_si256((__m256i *)(a + 32));
    const __m256i v_b2_w = _mm256_lddqu_si256((__m256i *)(b + 32));
    const __m256i v_a3_w = _mm256_lddqu_si256((__m256i *)(a + 48));
    const __m256i v_b3_w = _mm256_lddqu_si256((__m256i *)(b + 48));

    const __m256i v_ab0l_w = _mm256_unpacklo_epi16(v_a0_w, v_b0_w);
    const __m256i v_ab0h_w = _mm256_unpackhi_epi16(v_a0_w, v_b0_w);
    const __m256i v_ab1l_w = _mm256_unpacklo_epi16(v_a1_w, v_b1_w);
    const __m256i v_ab1h_w = _mm256_unpackhi_epi16(v_a1_w, v_b1_w);
    const __m256i v_ab2l_w = _mm256_unpacklo_epi16(v_a2_w, v_b2_w);
    const __m256i v_ab2h_w = _mm256_unpackhi_epi16(v_a2_w, v_b2_w);
    const __m256i v_ab3l_w = _mm256_unpacklo_epi16(v_a3_w, v_b3_w);
    const __m256i v_ab3h_w = _mm256_unpackhi_epi16(v_a3_w, v_b3_w);

    // Negate top word of pairs
    const __m256i v_abl0n_w = _mm256_sign_epi16(v_ab0l_w, v_neg_w);
    const __m256i v_abh0n_w = _mm256_sign_epi16(v_ab0h_w, v_neg_w);
    const __m256i v_abl1n_w = _mm256_sign_epi16(v_ab1l_w, v_neg_w);
    const __m256i v_abh1n_w = _mm256_sign_epi16(v_ab1h_w, v_neg_w);
    const __m256i v_abl2n_w = _mm256_sign_epi16(v_ab2l_w, v_neg_w);
    const __m256i v_abh2n_w = _mm256_sign_epi16(v_ab2h_w, v_neg_w);
    const __m256i v_abl3n_w = _mm256_sign_epi16(v_ab3l_w, v_neg_w);
    const __m256i v_abh3n_w = _mm256_sign_epi16(v_ab3h_w, v_neg_w);

    const __m256i v_r0l_w = _mm256_madd_epi16(v_ab0l_w, v_abl0n_w);
    const __m256i v_r0h_w = _mm256_madd_epi16(v_ab0h_w, v_abh0n_w);
    const __m256i v_r1l_w = _mm256_madd_epi16(v_ab1l_w, v_abl1n_w);
    const __m256i v_r1h_w = _mm256_madd_epi16(v_ab1h_w, v_abh1n_w);
    const __m256i v_r2l_w = _mm256_madd_epi16(v_ab2l_w, v_abl2n_w);
    const __m256i v_r2h_w = _mm256_madd_epi16(v_ab2h_w, v_abh2n_w);
    const __m256i v_r3l_w = _mm256_madd_epi16(v_ab3l_w, v_abl3n_w);
    const __m256i v_r3h_w = _mm256_madd_epi16(v_ab3h_w, v_abh3n_w);

    const __m256i v_r0_w = _mm256_packs_epi32(v_r0l_w, v_r0h_w);
    const __m256i v_r1_w = _mm256_packs_epi32(v_r1l_w, v_r1h_w);
    const __m256i v_r2_w = _mm256_packs_epi32(v_r2l_w, v_r2h_w);
    const __m256i v_r3_w = _mm256_packs_epi32(v_r3l_w, v_r3h_w);

    _mm256_store_si256((__m256i *)(d), v_r0_w);
    _mm256_store_si256((__m256i *)(d + 16), v_r1_w);
    _mm256_store_si256((__m256i *)(d + 32), v_r2_w);
    _mm256_store_si256((__m256i *)(d + 48), v_r3_w);

    a += 64;
    b += 64;
    d += 64;
    N -= 64;
  } while (N);
}